

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.c
# Opt level: O0

int enter_atom_into_cache(atom_server as,send_get_atom_msg_ptr msg)

{
  char *__ptr;
  undefined8 *__ptr_00;
  long lVar1;
  long *in_RSI;
  long in_RDI;
  Tcl_HashEntry *entry;
  send_get_atom_msg_ptr stored;
  char *str;
  int new;
  int local_1c;
  long *local_18;
  long local_10;
  int local_4;
  
  if ((*in_RSI == 0) || ((int)in_RSI[1] == -1)) {
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    __ptr = strdup((char *)*in_RSI);
    __ptr_00 = (undefined8 *)malloc(0x10);
    *__ptr_00 = __ptr;
    *(int *)(__ptr_00 + 1) = (int)local_18[1];
    lVar1 = (**(code **)(local_10 + 0x80))(local_10 + 0x38,__ptr,&local_1c);
    if (local_1c == 0) {
      free(__ptr_00);
      free(__ptr);
      local_4 = 0;
    }
    else {
      *(undefined8 **)(lVar1 + 0x18) = __ptr_00;
      lVar1 = (**(code **)(local_10 + 0xd0))(local_10 + 0x88,(long)*(int *)(__ptr_00 + 1),&local_1c)
      ;
      if (local_1c == 0) {
        printf("Serious internal error in atom cache.  Duplicate value hash entry.\n");
        exit(1);
      }
      *(undefined8 **)(lVar1 + 0x18) = __ptr_00;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static
int
enter_atom_into_cache(atom_server as, send_get_atom_msg_ptr msg)
{
    int new;
    char *str;
    send_get_atom_msg_ptr stored;
    Tcl_HashEntry *entry = NULL;

    if ((msg->atom_string == NULL) || (msg->atom == -1))
	return 0;
    str = strdup(msg->atom_string);
    stored = (send_get_atom_msg_ptr) malloc(sizeof(send_get_atom_msg));
    stored->atom_string = str;
    stored->atom = msg->atom;

    /* enter into string hash table */
    entry = Tcl_CreateHashEntry(&as->string_hash_table, str, &new);
    if (!new) {
	/* already inserted by someone else */
	free(stored);
	free(str);
	return 0;
    }
    Tcl_SetHashValue(entry, stored);
    /* enter into value hash table */
    entry = Tcl_CreateHashEntry(&as->value_hash_table,
				(char *) (int64_t) stored->atom, &new);
    if (!new) {
	printf("Serious internal error in atom cache.  Duplicate value hash entry.\n");
	exit(1);
    }
    Tcl_SetHashValue(entry, stored);
    return 1;
}